

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_option_function<unsigned_long>
          (App *this,string *option_name,function<void_(const_unsigned_long_&)> *func,
          string *option_description)

{
  pointer pcVar1;
  Option *this_00;
  anon_class_32_1_898bcfc2 fun;
  _Any_data _Stack_e8;
  code *local_d8;
  _Any_data local_c8;
  code *local_b8;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  string local_80;
  string local_60;
  string local_40;
  
  std::function<void_(const_unsigned_long_&)>::function
            ((function<void_(const_unsigned_long_&)> *)&local_c8,func);
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + option_name->_M_string_length);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_option_function<unsigned_long>(std::__cxx11::string,std::function<void(unsigned_long_const&)>const&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)_Stack_e8._M_pod_data,(anon_class_32_1_898bcfc2 *)&local_c8);
  pcVar1 = (option_description->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + option_description->_M_string_length);
  local_98 = (code *)0x0;
  uStack_90 = 0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  this_00 = add_option(this,&local_40,(callback_t *)&_Stack_e8,&local_60,false,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                        *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&_Stack_e8,&_Stack_e8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"UINT","");
  Option::type_name(this_00,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  this_00->type_size_max_ = 1;
  this_00->type_size_min_ = 1;
  this_00->expected_min_ = 1;
  this_00->expected_max_ = 1;
  this_00->flag_like_ = false;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return this_00;
}

Assistant:

Option *add_option_function(std::string option_name,
                                const std::function<void(const ArgType &)> &func,  ///< the callback to execute
                                std::string option_description = "") {

        auto fun = [func](const CLI::results_t &res) {
            ArgType variable;
            bool result = detail::lexical_conversion<ArgType, ArgType>(res, variable);
            if(result) {
                func(variable);
            }
            return result;
        };

        Option *opt = add_option(option_name, std::move(fun), option_description, false);
        opt->type_name(detail::type_name<ArgType>());
        opt->type_size(detail::type_count_min<ArgType>::value, detail::type_count<ArgType>::value);
        opt->expected(detail::expected_count<ArgType>::value);
        return opt;
    }